

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O3

SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> * __thiscall
SafeInt<long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
          (SafeInt<long,safeint_exception_handlers::SafeInt_InvalidParameter> *this,char bits)

{
  if (bits < '\0') {
    __assert_fail("!std::numeric_limits< U >::is_signed || bits >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dcleblanc[P]SafeInt/Test/../SafeInt.hpp"
                  ,0x17a9,
                  "SafeInt<T, E> &SafeInt<long>::operator>>=(U) [T = long, E = safeint_exception_handlers::SafeInt_InvalidParameter, U = char]"
                 );
  }
  if ((byte)bits < 0x40) {
    *(long *)this = *(long *)this >> (bits & 0x3fU);
    return (SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)this;
  }
  __assert_fail("bits < (int)safeint_internal::int_traits< T >::bitCount",
                "/workspace/llm4binary/github/license_c_cmakelists/dcleblanc[P]SafeInt/Test/../SafeInt.hpp"
                ,0x17aa,
                "SafeInt<T, E> &SafeInt<long>::operator>>=(U) [T = long, E = safeint_exception_handlers::SafeInt_InvalidParameter, U = char]"
               );
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E >& operator >>=( U bits ) SAFEINT_NOTHROW
    {
        ShiftAssert( !std::numeric_limits< U >::is_signed || bits >= 0 );
        ShiftAssert( bits < (int)safeint_internal::int_traits< T >::bitCount );

        m_int >>= bits;
        return *this;
    }